

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint32 CityHash32(char *s,size_t len)

{
  uint32 a;
  uint32 a_00;
  uint32 a_01;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32 uVar5;
  uint32 uVar6;
  ulong uVar7;
  size_t i;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar6 = (uint32)len;
  if (0x18 < len) {
    uVar10 = (*(int *)(s + (len - 4)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar6;
    uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64 ^
             (*(int *)(s + (len - 0x10)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 0x10)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar3 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
    uVar10 = (*(int *)(s + (len - 8)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
             uVar6 * -0x3361d2af;
    uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64 ^
             (*(int *)(s + (len - 0xc)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 0xc)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar12 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
    uVar10 = (*(int *)(s + (len - 0x14)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 0x14)) * -0x3361d2af) >> 0x11) * 0x1b873593 +
             uVar6 * -0x3361d2af;
    uVar10 = (uVar10 * 0x2000 | uVar10 >> 0x13) * 5 + 0xe6546b64;
    uVar7 = (len - 1) / 0x14;
    do {
      uVar9 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593;
      uVar12 = (*(int *)((long)s + 8) * 0x16a88000 |
               (uint)(*(int *)((long)s + 8) * -0x3361d2af) >> 0x11) * 0x1b873593 + uVar12;
      uVar3 = uVar3 ^ uVar9;
      uVar11 = uVar10 + *(int *)((long)s + 4);
      uVar3 = (*(int *)((long)s + 0xc) * 0x16a88000 |
              (uint)(*(int *)((long)s + 0xc) * -0x3361d2af) >> 0x11) * 0x1b873593 +
              *(int *)((long)s + 4) ^ (uVar3 << 0xe | uVar3 >> 0x12) * 5 + 0xe6546b64;
      uVar10 = (uVar12 * 0x4000 | uVar12 >> 0x12) * 5 + 0xe6546b64 ^ *(uint *)((long)s + 0x10);
      uVar1 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8;
      uVar10 = (uVar1 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18) * 5;
      uVar3 = ((uVar3 << 0xd | uVar3 >> 0x13) + *(uint *)((long)s + 0x10)) * 5 + 0xe6546b64;
      uVar2 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8;
      uVar12 = uVar2 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
      uVar3 = (uVar11 * 0x2000 | uVar11 >> 0x13) * -0x3361d2af + uVar9;
      s = (char *)((long)s + 0x14);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar3 = ((uVar12 >> 0xb) * 0x16a88000 | (uVar2 << 0x15 | uVar12 >> 0xb) * -0x3361d2af >> 0x11) *
            -0x3361d2af + uVar3;
    uVar3 = (uVar3 * 0x2000 | uVar3 >> 0x13) * 5 + 0xe6546b64;
    iVar4 = (uVar3 * 0x8000 | uVar3 >> 0x11) +
            ((uVar10 >> 0xb) * 0x16a88000 | (uVar1 * 0xa00000 | uVar10 >> 0xb) * -0x3361d2af >> 0x11
            );
    uVar10 = (iVar4 * -0x3a55e000 | (uint)(iVar4 * -0x3361d2af) >> 0x13) * 5 + 0xe6546b64;
    return (uVar10 * 0x8000 | uVar10 >> 0x11) * -0x3361d2af;
  }
  if (len < 0xd) {
    if (4 < len) {
      iVar4 = *(int *)(s + (len - 4));
      uVar10 = *(int *)(s + (uVar6 >> 1 & 4)) + 9;
      uVar5 = Mur(*(int *)s + uVar6,uVar6 * 5);
      uVar6 = Mur(iVar4 + uVar6 * 5,uVar5);
      goto LAB_001305d1;
    }
    uVar3 = 9;
    uVar10 = 0;
    for (sVar8 = 0; len != sVar8; sVar8 = sVar8 + 1) {
      uVar10 = uVar10 * -0x3361d2af + (int)s[sVar8];
      uVar3 = uVar3 ^ uVar10;
    }
  }
  else {
    uVar5 = *(uint32 *)s;
    a = *(uint32 *)(s + 4);
    a_00 = *(uint32 *)(s + (len >> 1));
    a_01 = *(uint32 *)(s + (len - 8));
    uVar10 = *(uint *)(s + (len - 4));
    uVar6 = Mur(*(uint32 *)(s + ((len >> 1) - 4)),uVar6);
    uVar6 = Mur(a,uVar6);
    uVar6 = Mur(a_01,uVar6);
    uVar3 = Mur(a_00,uVar6);
    uVar6 = uVar5;
  }
  uVar6 = Mur(uVar6,uVar3);
LAB_001305d1:
  uVar6 = Mur(uVar10,uVar6);
  uVar6 = fmix(uVar6);
  return uVar6;
}

Assistant:

uint32 CityHash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len)) :
        Hash32Len13to24(s, len);
  }

  // len > 24
  uint32 h = len, g = c1 * len, f = g;
  uint32 a0 = Rotate32(Fetch32(s + len - 4) * c1, 17) * c2;
  uint32 a1 = Rotate32(Fetch32(s + len - 8) * c1, 17) * c2;
  uint32 a2 = Rotate32(Fetch32(s + len - 16) * c1, 17) * c2;
  uint32 a3 = Rotate32(Fetch32(s + len - 12) * c1, 17) * c2;
  uint32 a4 = Rotate32(Fetch32(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate32(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate32(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate32(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate32(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate32(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32 a0 = Rotate32(Fetch32(s) * c1, 17) * c2;
    uint32 a1 = Fetch32(s + 4);
    uint32 a2 = Rotate32(Fetch32(s + 8) * c1, 17) * c2;
    uint32 a3 = Rotate32(Fetch32(s + 12) * c1, 17) * c2;
    uint32 a4 = Fetch32(s + 16);
    h ^= a0;
    h = Rotate32(h, 18);
    h = h * 5 + 0xe6546b64;
    f += a1;
    f = Rotate32(f, 19);
    f = f * c1;
    g += a2;
    g = Rotate32(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= a3 + a1;
    h = Rotate32(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= a4;
    g = bswap_32(g) * 5;
    h += a4 * 5;
    h = bswap_32(h);
    f += a0;
    PERMUTE3(f, h, g);
    s += 20;
  } while (--iters != 0);
  g = Rotate32(g, 11) * c1;
  g = Rotate32(g, 17) * c1;
  f = Rotate32(f, 11) * c1;
  f = Rotate32(f, 17) * c1;
  h = Rotate32(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate32(h, 17) * c1;
  h = Rotate32(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate32(h, 17) * c1;
  return h;
}